

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O0

void test_writers(void)

{
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [32];
  undefined1 local_2f0 [8];
  fd_writer w_2;
  int f_2;
  allocator local_2b1;
  string local_2b0 [32];
  undefined1 local_290 [8];
  file_writer w_1;
  FILE *f_1;
  string local_270 [39];
  allocator local_249;
  string local_248 [48];
  undefined1 local_218 [8];
  stream_writer w;
  ofstream f;
  
  std::ofstream::ofstream(&w.m_stream,"test_files/tmp.json",0x10);
  argo::stream_writer::stream_writer((stream_writer *)local_218,(ostream *)&w.m_stream);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"{ \"one\" : 1 }",&local_249);
  argo::operator<<((writer *)local_218,(string *)local_248);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::ofstream::close();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"stream",(allocator *)((long)&f_1 + 7));
  test_writer((string *)local_270);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)((long)&f_1 + 7));
  argo::stream_writer::~stream_writer((stream_writer *)local_218);
  std::ofstream::~ofstream(&w.m_stream);
  w_1.m_file = (FILE *)fopen("test_files/tmp.json","w");
  argo::file_writer::file_writer((file_writer *)local_290,w_1.m_file);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"{ \"one\" : 1 }",&local_2b1);
  argo::operator<<((writer *)local_290,(string *)local_2b0);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  fclose((FILE *)w_1.m_file);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&f_2,"file",(allocator *)&w_2.field_0xf);
  test_writer((string *)&f_2);
  std::__cxx11::string::~string((string *)&f_2);
  std::allocator<char>::~allocator((allocator<char> *)&w_2.field_0xf);
  argo::file_writer::~file_writer((file_writer *)local_290);
  w_2.m_fd = open("test_files/tmp.json",0x41,0);
  argo::fd_writer::fd_writer((fd_writer *)local_2f0,w_2.m_fd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"{ \"one\" : 1 }",&local_311);
  argo::operator<<((writer *)local_2f0,(string *)local_310);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  close(w_2.m_fd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"fd",&local_339);
  test_writer((string *)local_338);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  argo::fd_writer::~fd_writer((fd_writer *)local_2f0);
  return;
}

Assistant:

void test_writers()
{
    {
        ofstream f("test_files/tmp.json");
        stream_writer w(&f);
        w << "{ \"one\" : 1 }";
        f.close();
        test_writer("stream");
    }

    {
        FILE *f = fopen("test_files/tmp.json", "w");
        file_writer w(f);
        w << "{ \"one\" : 1 }";
        fclose(f);
        test_writer("file");
    }

#ifndef _ARGO_WINDOWS_
    {
        int f = open("test_files/tmp.json", O_CREAT | O_WRONLY, 0);
        fd_writer w(f);
        w << "{ \"one\" : 1 }";
        close(f);
        test_writer("fd");
    }
#endif
}